

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

int testing::internal::
    CountIf<std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>,bool(*)(testing::TestInfo_const*)>
              (vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *c,
              _func_bool_TestInfo_ptr *predicate)

{
  bool bVar1;
  reference ppTVar2;
  long in_FS_OFFSET;
  int local_34;
  int count;
  _func_bool_TestInfo_ptr *predicate_local;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *c_local;
  __normal_iterator<testing::TestInfo_*const_*,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
  local_18;
  const_iterator it;
  
  it._M_current = *(TestInfo ***)(in_FS_OFFSET + 0x28);
  local_34 = 0;
  local_18._M_current =
       (TestInfo **)std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::begin(c)
  ;
  while( true ) {
    c_local = (vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *)
              std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::end(c);
    bVar1 = __gnu_cxx::operator!=
                      (&local_18,
                       (__normal_iterator<testing::TestInfo_*const_*,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
                        *)&c_local);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<testing::TestInfo_*const_*,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
              ::operator*(&local_18);
    bVar1 = (*predicate)(*ppTVar2);
    if (bVar1) {
      local_34 = local_34 + 1;
    }
    __gnu_cxx::
    __normal_iterator<testing::TestInfo_*const_*,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
    ::operator++(&local_18);
  }
  if (*(TestInfo ***)(in_FS_OFFSET + 0x28) != it._M_current) {
    __stack_chk_fail();
  }
  return local_34;
}

Assistant:

inline int CountIf(const Container& c, Predicate predicate) {
  // Implemented as an explicit loop since std::count_if() in libCstd on
  // Solaris has a non-standard signature.
  int count = 0;
  for (typename Container::const_iterator it = c.begin(); it != c.end(); ++it) {
    if (predicate(*it))
      ++count;
  }
  return count;
}